

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Am_Connection::Handle_Input(Am_Connection *this)

{
  Am_Connection_Data *pAVar1;
  Am_Unmarshall_Method AVar2;
  Am_Value in_value;
  Am_Value local_20;
  unsigned_long net_type;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Connection_Data *)0x0) {
    Am_Error("Invalid Connection called to handle input!");
  }
  if (pAVar1->connected != false) {
    in_value.type = 0;
    in_value.value.wrapper_value = (Am_Wrapper *)0x0;
    recv(*(int *)&(pAVar1->super_Am_Wrapper).field_0xc,&net_type,8,0);
    local_20.type =
         (ushort)(byte)((uint)(undefined4)net_type >> 0x18) |
         (ushort)((uint)(undefined4)net_type >> 8) & 0xff00;
    AVar2 = OpenAmulet::Map<unsigned_short,_Am_Unmarshall_Method,_std::less<unsigned_short>_>::GetAt
                      (&Unmarshall_Methods,&local_20.type);
    if (AVar2.from_wrapper == (Am_Method_Wrapper *)0x0) {
      std::operator<<((ostream *)&std::cerr,"C:hi:Unknown type received!\n");
      std::ostream::flush();
      Am_Value::operator=(&in_value,&Am_No_Value);
      if (this->data != (Am_Connection_Data *)0x0) {
        this->data->connected = false;
      }
    }
    else {
      (*AVar2.Call)((int)&local_20,
                    (Am_Connection *)*(undefined4 *)&(this->data->super_Am_Wrapper).field_0xc);
      Am_Value::operator=(&in_value,&local_20);
      Am_Value::~Am_Value(&local_20);
      Am_Value_List::Add(&this->data->Value_Queue,&in_value,Am_TAIL,true);
      if ((this->data->my_receiver).from_wrapper != (Am_Method_Wrapper *)0x0) {
        (*(this->data->my_receiver).Call)(this);
      }
    }
    Am_Value::~Am_Value(&in_value);
    return;
  }
  Am_Error("C:HandIn:Error! Not connected!");
}

Assistant:

bool
Am_Connection::Valid(void)
{
  return (data ? true : false);
}